

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

long getarg(int x,int y,STATE s)

{
  int local_18;
  STATE s_local;
  int y_local;
  int x_local;
  
  if (s == AI_COLOR) {
    local_18 = arg[x][y];
  }
  else {
    local_18 = -arg[x][y];
  }
  return (long)local_18;
}

Assistant:

long getarg(int x, int y, STATE s) {
    return (s == AI_COLOR ? arg[x][y] : -arg[x][y]);
/*#ifdef AI_COLOR_BLACK
	return (s == BLACK ? arg[x][y] : -arg[x][y]);
#endif
#ifdef AI_COLOR_WHITE
	return (s == WHITE ? arg[x][y] : -arg[x][y]);
#endif*/
}